

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_getaddrinfo.c
# Opt level: O3

void hquery_free(host_query *hquery,ares_bool_t cleanup_ai)

{
  if (cleanup_ai != ARES_FALSE) {
    ares_freeaddrinfo(hquery->ai);
  }
  ares_strsplit_free(hquery->names,hquery->names_cnt);
  ares_free(hquery->name);
  ares_free(hquery->lookups);
  ares_free(hquery);
  return;
}

Assistant:

static void hquery_free(struct host_query *hquery, ares_bool_t cleanup_ai)
{
  if (cleanup_ai) {
    ares_freeaddrinfo(hquery->ai);
  }
  ares_strsplit_free(hquery->names, hquery->names_cnt);
  ares_free(hquery->name);
  ares_free(hquery->lookups);
  ares_free(hquery);
}